

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int CBS_asn1_bitstring_has_bit(CBS *cbs,uint bit)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  iVar1 = CBS_is_valid_asn1_bitstring(cbs);
  uVar2 = 0;
  if ((iVar1 != 0) && (uVar3 = (ulong)(bit >> 3) + 1, uVar3 < cbs->len)) {
    uVar2 = (uint)((cbs->data[uVar3] >> (~(byte)bit & 7) & 1) != 0);
  }
  return uVar2;
}

Assistant:

int CBS_asn1_bitstring_has_bit(const CBS *cbs, unsigned bit) {
  if (!CBS_is_valid_asn1_bitstring(cbs)) {
    return 0;
  }

  const unsigned byte_num = (bit >> 3) + 1;
  const unsigned bit_num = 7 - (bit & 7);

  // Unused bits are zero, and this function does not distinguish between
  // missing and unset bits. Thus it is sufficient to do a byte-level length
  // check.
  return byte_num < CBS_len(cbs) &&
         (CBS_data(cbs)[byte_num] & (1 << bit_num)) != 0;
}